

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmodel.hpp
# Opt level: O0

bool __thiscall QtMWidgets::ListModel<QImage>::insertRows(ListModel<QImage> *this,int row,int count)

{
  int iVar1;
  ListModelPrivate<QImage> *pLVar2;
  qsizetype qVar3;
  QImage local_40 [28];
  int local_24;
  int local_20;
  int i;
  int count_local;
  int row_local;
  ListModel<QImage> *this_local;
  
  local_20 = count;
  i = row;
  _count_local = this;
  pLVar2 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
           ::operator->(&this->d);
  qVar3 = QList<QImage>::count(&pLVar2->data);
  if (qVar3 < row) {
    this_local._7_1_ = false;
  }
  else {
    for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
      pLVar2 = QScopedPointer<QtMWidgets::ListModelPrivate<QImage>,_QScopedPointerDeleter<QtMWidgets::ListModelPrivate<QImage>_>_>
               ::operator->(&this->d);
      iVar1 = i + local_24;
      QImage::QImage(local_40);
      QList<QImage>::insert(&pLVar2->data,(long)iVar1,local_40);
      QImage::~QImage(local_40);
    }
    AbstractListModel::rowsInserted(&this->super_AbstractListModel,i,i + local_20 + -1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool insertRows( int row, int count )
	{
		if( row > d->data.count() )
			return false;

		for( int i = 0; i < count; ++i )
			d->data.insert( row + i, T() );

		emit rowsInserted( row, row + count - 1 );

		return true;
	}